

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginGroup(void)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiGroupData *pIVar3;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  ImVec2 in_stack_ffffffffffffffe0;
  
  pIVar1 = GImGui;
  pIVar2 = GetCurrentWindow();
  ImVector<ImGuiGroupData>::resize
            ((ImVector<ImGuiGroupData> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  pIVar3 = ImVector<ImGuiGroupData>::back(&(pIVar2->DC).GroupStack);
  pIVar3->BackupCursorPos = (pIVar2->DC).CursorPos;
  pIVar3->BackupCursorMaxPos = (pIVar2->DC).CursorMaxPos;
  (pIVar3->BackupIndent).x = (pIVar2->DC).Indent.x;
  (pIVar3->BackupGroupOffset).x = (pIVar2->DC).GroupOffset.x;
  pIVar3->BackupCurrentLineSize = (pIVar2->DC).CurrentLineSize;
  pIVar3->BackupCurrentLineTextBaseOffset = (pIVar2->DC).CurrentLineTextBaseOffset;
  pIVar3->BackupLogLinePosY = (pIVar2->DC).LogLinePosY;
  pIVar3->BackupActiveIdIsAlive = pIVar1->ActiveIdIsAlive;
  pIVar3->BackupActiveIdPreviousFrameIsAlive = (bool)(pIVar1->ActiveIdPreviousFrameIsAlive & 1);
  pIVar3->AdvanceCursor = true;
  (pIVar2->DC).GroupOffset.x =
       ((pIVar2->DC).CursorPos.x - (pIVar2->Pos).x) - (pIVar2->DC).ColumnsOffset.x;
  (pIVar2->DC).Indent.x = (pIVar2->DC).GroupOffset.x;
  (pIVar2->DC).CursorMaxPos = (pIVar2->DC).CursorPos;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,0.0,0.0);
  (pIVar2->DC).CurrentLineSize = in_stack_ffffffffffffffe0;
  (pIVar2->DC).LogLinePosY = (pIVar2->DC).CursorPos.y - 9999.0;
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    window->DC.GroupStack.resize(window->DC.GroupStack.Size + 1);
    ImGuiGroupData& group_data = window->DC.GroupStack.back();
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrentLineSize = window->DC.CurrentLineSize;
    group_data.BackupCurrentLineTextBaseOffset = window->DC.CurrentLineTextBaseOffset;
    group_data.BackupLogLinePosY = window->DC.LogLinePosY;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.AdvanceCursor = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrentLineSize = ImVec2(0.0f, 0.0f);
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f; // To enforce Log carriage return
}